

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v5::format_system_error(v5 *this,buffer *out,int error_code,string_view message)

{
  char *__s;
  size_t sVar1;
  char *__s_00;
  size_t sVar2;
  void *__buf;
  undefined **__n;
  writer w;
  memory_buffer buf;
  
  buf.super_basic_buffer<char>.ptr_ = buf.store_;
  buf.super_basic_buffer<char>.size_ = 0;
  __n = &PTR_grow_00156010;
  buf.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00156010;
  buf.super_basic_buffer<char>.capacity_ = 500;
  internal::basic_buffer<char>::resize(&buf.super_basic_buffer<char>,500);
  while( true ) {
    sVar1 = buf.super_basic_buffer<char>.size_;
    __s = buf.super_basic_buffer<char>.ptr_;
    __s_00 = strerror_r((int)out,buf.super_basic_buffer<char>.ptr_,
                        buf.super_basic_buffer<char>.size_);
    if (__s != __s_00) break;
    sVar2 = strlen(__s);
    if (sVar2 != sVar1 - 1) break;
    internal::basic_buffer<char>::resize
              (&buf.super_basic_buffer<char>,buf.super_basic_buffer<char>.size_ * 2);
  }
  w.locale_.locale_ = (void *)0x0;
  w.out_.container = (basic_buffer<char> *)this;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (&w,error_code,message.data_,(size_t)__n);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (&w,0x138bc3,(void *)0x2,(size_t)__n);
  __buf = (void *)strlen(__s_00);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (&w,(int)__s_00,__buf,(size_t)__n);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buf);
  return;
}

Assistant:

FMT_FUNC void format_system_error(
    internal::buffer &out, int error_code, string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char *system_message = &buf[0];
      int result = safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        writer w(out);
        w.write(message);
        w.write(": ");
        w.write(system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }